

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O2

Population * __thiscall
Population::tournament_selection(Population *__return_storage_ptr__,Population *this,int generation)

{
  pointer pCVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  vector<Chromosome,_std::allocator<Chromosome>_> new_chromosomes;
  vector<Chromosome,_std::allocator<Chromosome>_> local_a8;
  Chromosome winner;
  
  new_chromosomes.super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  new_chromosomes.super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  new_chromosomes.super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pCVar1 = (this->chromosomes).super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->chromosomes).super__Vector_base<Chromosome,_std::allocator<Chromosome>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pCVar1) / 0x60;
  uVar5 = uVar3 & 0xffffffff;
  while (iVar2 = (int)uVar5, uVar5 = (ulong)(iVar2 - 1), iVar2 != 0) {
    iVar2 = rand();
    lVar4 = (long)iVar2 % (long)uVar3;
    iVar2 = rand();
    if (pCVar1[lVar4].fitness < pCVar1[(long)iVar2 % (long)uVar3].fitness ||
        pCVar1[lVar4].fitness == pCVar1[(long)iVar2 % (long)uVar3].fitness) {
      lVar4 = (long)iVar2 % (long)uVar3;
    }
    Chromosome::Chromosome(&winner,pCVar1 + lVar4);
    std::vector<Chromosome,_std::allocator<Chromosome>_>::emplace_back<Chromosome>
              (&new_chromosomes,&winner);
    Chromosome::~Chromosome(&winner);
  }
  std::vector<Chromosome,_std::allocator<Chromosome>_>::vector(&local_a8,&new_chromosomes);
  Population(__return_storage_ptr__,&local_a8);
  std::vector<Chromosome,_std::allocator<Chromosome>_>::~vector(&local_a8);
  std::vector<Chromosome,_std::allocator<Chromosome>_>::~vector(&new_chromosomes);
  return __return_storage_ptr__;
}

Assistant:

Population Population::tournament_selection(int generation) {

    std::vector<Chromosome> new_chromosomes;


    //Fisher-Yates shuffle
    int t_rounds = (int) chromosomes.size();
    //std::cout << crossover_count << std::endl;

    long left = std::distance(chromosomes.begin(), chromosomes.end());
    auto current = chromosomes.begin();

    while (t_rounds) {
        auto rI1 = current;
        auto rI2 = current;
        std::advance(rI1, rand() % left);
        std::advance(rI2, rand() % left);
        //std::swap(*current, *r);
        Chromosome &ch1 = (*(rI1));
        Chromosome &ch2 = (*(rI2));

        Chromosome winner = (ch1.getFitness() > ch2.getFitness()) ? ch1 : ch2;
        new_chromosomes.push_back(std::move(winner));

        --t_rounds;
    }

/*
    static const float t = 0.6f;
    std::uniform_int_distribution<int> uniform_dist(0, chromosomes.size());

    for (size_t i = 0; i < chromosomes.size(); ++i) {
        Chromosome* c1 = nullptr;
        while (!c1){
            int index = uniform_dist(randomEngine) - 1;

            Chromosome& c = chromosomes[index];
            if (&c != c1) {
                c1 = &c;
            }
        }

        Chromosome* c2 = nullptr;
        while (!c2) {
            int index = uniform_dist(randomEngine) - 1;
            Chromosome& c = chromosomes[index];
            if (&c != c2) {
                c2 = &c;
            }
        }



        float r = static_cast <float> (rand()) / static_cast <float> (RAND_MAX);
        if (r >= t) {
            winner = *c2;
        }

        new_chromosomes.push_back(std::move(winner));

    }
*/
    return Population(new_chromosomes);

 }